

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

void __thiscall dg::llvmdg::LazyLLVMCallGraph::_initializeAddressTaken(LazyLLVMCallGraph *this)

{
  pointer *pppFVar1;
  long lVar2;
  iterator __position;
  char cVar3;
  Function *in_RAX;
  Use *use;
  Function *pFVar4;
  Function *pFVar5;
  Module *pMVar6;
  Function *pFVar7;
  Module *pMVar8;
  Function *local_38;
  
  this->_address_taken_initialized = true;
  pMVar6 = *(Module **)(this->_module + 0x20);
  pMVar8 = this->_module + 0x18;
  if (pMVar6 != pMVar8) {
    local_38 = in_RAX;
    do {
      pFVar7 = (Function *)(pMVar6 + -0x38);
      if (pMVar6 == (Module *)0x0) {
        pFVar7 = (Function *)0x0;
      }
      cVar3 = llvm::GlobalValue::isDeclaration();
      pFVar4 = pFVar7;
      if (cVar3 == '\0') {
        do {
          pFVar4 = *(Function **)(pFVar4 + 8);
          if (pFVar4 == (Function *)0x0) goto LAB_00117eaa;
          lVar2 = *(long *)(pFVar4 + 0x18);
          if ((lVar2 == 0) || (*(char *)(lVar2 + 0x10) != 'S')) break;
          pFVar5 = *(Function **)(lVar2 + -0x20);
          if (pFVar5 == (Function *)0x0) {
            pFVar5 = (Function *)0x0;
          }
          else if (pFVar5[0x10] != (Function)0x0) {
            pFVar5 = (Function *)0x0;
          }
          if ((pFVar5 == (Function *)0x0) || (*(long *)(pFVar5 + 0x18) != *(long *)(lVar2 + 0x48)))
          {
            pFVar5 = (Function *)0x0;
          }
        } while (pFVar5 == pFVar7);
        if (pFVar4 != (Function *)0x0) {
          __position._M_current =
               (this->_address_taken).
               super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_38 = pFVar7;
          if (__position._M_current ==
              (this->_address_taken).
              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
            _M_realloc_insert<llvm::Function_const*>
                      ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                       &this->_address_taken,__position,&local_38);
          }
          else {
            *__position._M_current = pFVar7;
            pppFVar1 = &(this->_address_taken).
                        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
          }
        }
      }
LAB_00117eaa:
      pMVar6 = *(Module **)(pMVar6 + 8);
    } while (pMVar6 != pMVar8);
  }
  return;
}

Assistant:

void _initializeAddressTaken() {
        assert(!_address_taken_initialized);
        _address_taken_initialized = true;

        for (auto &F : *_module) {
            if (F.isDeclaration())
                continue;
            if (funHasAddressTaken(&F)) {
                _address_taken.push_back(&F);
            }
        }
    }